

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

void __thiscall Population::printChromos(Population *this)

{
  pointer pCVar1;
  ostream *poVar2;
  pointer pCVar3;
  Chromosome chromo;
  
  pCVar1 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar3 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>.
                _M_impl.super__Vector_impl_data._M_start; pCVar3 != pCVar1; pCVar3 = pCVar3 + 1) {
    Chromosome::Chromosome(&chromo,pCVar3);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,chromo.id);
    std::operator<<(poVar2,": ");
    Chromosome::printTurns(&chromo);
    Chromosome::~Chromosome(&chromo);
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Population::printChromos() {


    for (auto chromo : chromosomes){
        std::cout << chromo.id << ": ";
        chromo.printTurns();
    }
    std::cout << chromosomes.size()<< std::endl;
}